

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O0

ResourceArray * __thiscall
icu_63::ResourceDataValue::getArray
          (ResourceArray *__return_storage_ptr__,ResourceDataValue *this,UErrorCode *errorCode)

{
  UBool UVar1;
  uint uVar2;
  uint *puVar3;
  ushort *puVar4;
  uint uVar5;
  uint local_30;
  int32_t length;
  uint32_t offset;
  Resource *items32;
  uint16_t *items16;
  UErrorCode *errorCode_local;
  ResourceDataValue *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    items32 = (Resource *)0x0;
    _length = (uint32_t *)0x0;
    uVar5 = this->res & 0xfffffff;
    local_30 = 0;
    uVar2 = this->res >> 0x1c;
    if (uVar2 == 8) {
      if (uVar5 != 0) {
        puVar3 = (uint *)(this->pResData->pRoot + uVar5);
        _length = puVar3 + 1;
        local_30 = *puVar3;
      }
    }
    else {
      if (uVar2 != 9) {
        *errorCode = U_RESOURCE_TYPE_MISMATCH;
        ResourceArray::ResourceArray(__return_storage_ptr__);
        return __return_storage_ptr__;
      }
      puVar4 = this->pResData->p16BitUnits + uVar5;
      items32 = (Resource *)(puVar4 + 1);
      local_30 = (uint)*puVar4;
    }
    ResourceArray::ResourceArray(__return_storage_ptr__,(uint16_t *)items32,_length,local_30);
  }
  else {
    ResourceArray::ResourceArray(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

ResourceArray ResourceDataValue::getArray(UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) {
        return ResourceArray();
    }
    const uint16_t *items16 = NULL;
    const Resource *items32 = NULL;
    uint32_t offset=RES_GET_OFFSET(res);
    int32_t length = 0;
    switch(RES_GET_TYPE(res)) {
    case URES_ARRAY:
        if (offset!=0) {  // empty if offset==0
            items32 = (const Resource *)pResData->pRoot+offset;
            length = *items32++;
        }
        break;
    case URES_ARRAY16:
        items16 = pResData->p16BitUnits+offset;
        length = *items16++;
        break;
    default:
        errorCode = U_RESOURCE_TYPE_MISMATCH;
        return ResourceArray();
    }
    return ResourceArray(items16, items32, length);
}